

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

bool __thiscall
cmake::FindPackage(cmake *this,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *args)

{
  cmLocalGenerator *this_00;
  pointer __s;
  byte bVar1;
  PositionType this_01;
  bool bVar2;
  cmGlobalGenerator *this_02;
  cmMakefile *this_03;
  string *psVar3;
  undefined8 uVar4;
  reference ppcVar5;
  undefined8 uVar6;
  cmTarget *this_04;
  char *value;
  cmGeneratorTarget *this_05;
  bool in_DL;
  bool collapse;
  bool collapse_00;
  bool collapse_01;
  cmOutputConverter *local_828;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  cmStateSnapshot local_618;
  cmStateDirectory local_600;
  undefined1 local_5d8 [8];
  cmLinkLineComputer linkLineComputer;
  cmLocalGenerator *lg_1;
  cmGeneratorTarget *gtgt;
  string linkFlags;
  string flags;
  string linkPath;
  string frameworkPath;
  string linkLibs;
  allocator<char> local_4c1;
  string local_4c0;
  undefined1 local_4a0 [8];
  string buildType;
  string *lib;
  iterator __end5;
  iterator __begin5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libList;
  string local_440;
  undefined1 local_420 [8];
  string libs;
  string local_3f8;
  allocator<char> local_3d1;
  string local_3d0;
  cmTarget *local_3b0;
  cmTarget *tgt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srcs;
  char *targetName;
  string local_380;
  string local_360 [8];
  string definitions;
  string local_338;
  undefined1 local_318 [8];
  string includeFlags;
  cmLocalGenerator *lg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includeDirs;
  string local_2d0;
  undefined1 local_2b0 [8];
  string includes;
  string local_288;
  byte local_262;
  allocator<char> local_261;
  undefined1 local_260 [6];
  bool quiet;
  byte local_23a;
  allocator<char> local_239;
  undefined1 local_238 [6];
  bool packageFound;
  string local_218 [8];
  string packageName;
  string local_1f0;
  undefined1 local_1d0 [8];
  string mode;
  string local_1a8;
  undefined1 local_188 [8];
  string language;
  string local_160;
  undefined1 local_140 [8];
  string systemFile;
  cmMakefile *mf;
  cmStateDirectory local_f8;
  string local_d0;
  cmStateDirectory local_b0;
  undefined1 local_88 [8];
  cmStateSnapshot snapshot;
  cmGlobalGenerator *gg;
  string local_38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmake *this_local;
  
  local_18 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&local_38,(SystemTools *)0x1,in_DL);
  SetHomeDirectory(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            ((string *)&gg,(SystemTools *)0x1,collapse);
  SetHomeOutputDirectory(this,(string *)&gg);
  std::__cxx11::string::~string((string *)&gg);
  this_02 = (cmGlobalGenerator *)operator_new(0x608);
  cmGlobalGenerator::cmGlobalGenerator(this_02,this);
  snapshot.Position.Position = (PositionType)this_02;
  SetGlobalGenerator(this,this_02);
  GetCurrentSnapshot((cmStateSnapshot *)local_88,this);
  cmStateSnapshot::GetDirectory(&local_b0,(cmStateSnapshot *)local_88);
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            (&local_d0,(SystemTools *)0x1,collapse_00);
  cmStateDirectory::SetCurrentBinary(&local_b0,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  cmStateSnapshot::GetDirectory(&local_f8,(cmStateSnapshot *)local_88);
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            ((string *)&mf,(SystemTools *)0x1,collapse_01);
  cmStateDirectory::SetCurrentSource(&local_f8,(string *)&mf);
  std::__cxx11::string::~string((string *)&mf);
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)local_88);
  this_03 = (cmMakefile *)operator_new(0x7e8);
  cmMakefile::cmMakefile
            (this_03,(cmGlobalGenerator *)snapshot.Position.Position,(cmStateSnapshot *)local_88);
  systemFile.field_2._8_8_ = this_03;
  cmGlobalGenerator::AddMakefile((cmGlobalGenerator *)snapshot.Position.Position,this_03);
  cmMakefile::SetArgcArgv((cmMakefile *)systemFile.field_2._8_8_,local_18);
  uVar4 = systemFile.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"CMakeFindPackageMode.cmake",
             (allocator<char> *)(language.field_2._M_local_buf + 0xf));
  cmMakefile::GetModulesFile((string *)local_140,(cmMakefile *)uVar4,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)(language.field_2._M_local_buf + 0xf));
  cmMakefile::ReadListFile((cmMakefile *)systemFile.field_2._8_8_,(string *)local_140);
  uVar4 = systemFile.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"LANGUAGE",(allocator<char> *)(mode.field_2._M_local_buf + 0xf));
  psVar3 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar4,&local_1a8);
  std::__cxx11::string::string((string *)local_188,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)(mode.field_2._M_local_buf + 0xf));
  uVar4 = systemFile.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"MODE",(allocator<char> *)(packageName.field_2._M_local_buf + 0xf)
            );
  psVar3 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar4,&local_1f0);
  std::__cxx11::string::string((string *)local_1d0,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)(packageName.field_2._M_local_buf + 0xf));
  uVar4 = systemFile.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_238,"NAME",&local_239);
  psVar3 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar4,(string *)local_238);
  std::__cxx11::string::string(local_218,(string *)psVar3);
  std::__cxx11::string::~string((string *)local_238);
  std::allocator<char>::~allocator(&local_239);
  uVar4 = systemFile.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_260,"PACKAGE_FOUND",&local_261)
  ;
  bVar2 = cmMakefile::IsOn((cmMakefile *)uVar4,(string *)local_260);
  std::__cxx11::string::~string((string *)local_260);
  std::allocator<char>::~allocator(&local_261);
  uVar4 = systemFile.field_2._8_8_;
  local_23a = bVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,"PACKAGE_QUIET",
             (allocator<char> *)(includes.field_2._M_local_buf + 0xf));
  bVar2 = cmMakefile::IsOn((cmMakefile *)uVar4,&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator((allocator<char> *)(includes.field_2._M_local_buf + 0xf));
  local_262 = bVar2;
  if ((local_23a & 1) == 0) {
    if (!bVar2) {
      uVar4 = std::__cxx11::string::c_str();
      printf("%s not found.\n",uVar4);
    }
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1d0,"EXIST");
    if (bVar2) {
      if ((local_262 & 1) == 0) {
        uVar4 = std::__cxx11::string::c_str();
        printf("%s found.\n",uVar4);
      }
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_1d0,"COMPILE");
      uVar4 = systemFile.field_2._8_8_;
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2d0,"PACKAGE_INCLUDE_DIRS",
                   (allocator<char> *)
                   ((long)&includeDirs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        psVar3 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar4,&local_2d0);
        std::__cxx11::string::string((string *)local_2b0,(string *)psVar3);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&includeDirs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&lg);
        cmSystemTools::ExpandListArgument
                  ((string *)local_2b0,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&lg,false);
        cmGlobalGenerator::CreateGenerationObjects
                  ((cmGlobalGenerator *)snapshot.Position.Position,AllTargets);
        ppcVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                            ((vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)
                             (snapshot.Position.Position + 0x98),0);
        this_00 = *ppcVar5;
        includeFlags.field_2._8_8_ = this_00;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_338,"",
                   (allocator<char> *)(definitions.field_2._M_local_buf + 0xf));
        cmLocalGenerator::GetIncludeFlags
                  ((string *)local_318,this_00,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&lg,(cmGeneratorTarget *)0x0,(string *)local_188,false,false,&local_338);
        std::__cxx11::string::~string((string *)&local_338);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(definitions.field_2._M_local_buf + 0xf));
        uVar4 = systemFile.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_380,"PACKAGE_DEFINITIONS",
                   (allocator<char> *)((long)&targetName + 7));
        psVar3 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar4,&local_380);
        std::__cxx11::string::string(local_360,(string *)psVar3);
        std::__cxx11::string::~string((string *)&local_380);
        std::allocator<char>::~allocator((allocator<char> *)((long)&targetName + 7));
        uVar4 = std::__cxx11::string::c_str();
        uVar6 = std::__cxx11::string::c_str();
        printf("%s %s\n",uVar4,uVar6);
        std::__cxx11::string::~string(local_360);
        std::__cxx11::string::~string((string *)local_318);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&lg);
        std::__cxx11::string::~string((string *)local_2b0);
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_1d0,"LINK");
        if (bVar2) {
          srcs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_390025;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&tgt);
          uVar4 = systemFile.field_2._8_8_;
          __s = srcs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3d0,(char *)__s,&local_3d1);
          this_04 = cmMakefile::AddExecutable
                              ((cmMakefile *)uVar4,&local_3d0,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&tgt,true);
          std::__cxx11::string::~string((string *)&local_3d0);
          std::allocator<char>::~allocator(&local_3d1);
          local_3b0 = this_04;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3f8,"LINKER_LANGUAGE",
                     (allocator<char> *)(libs.field_2._M_local_buf + 0xf));
          value = (char *)std::__cxx11::string::c_str();
          cmTarget::SetProperty(this_04,&local_3f8,value);
          std::__cxx11::string::~string((string *)&local_3f8);
          std::allocator<char>::~allocator((allocator<char> *)(libs.field_2._M_local_buf + 0xf));
          uVar4 = systemFile.field_2._8_8_;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_440,"PACKAGE_LIBRARIES",
                     (allocator<char> *)
                     ((long)&libList.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          psVar3 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar4,&local_440);
          std::__cxx11::string::string((string *)local_420,(string *)psVar3);
          std::__cxx11::string::~string((string *)&local_440);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&libList.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range5);
          cmSystemTools::ExpandListArgument
                    ((string *)local_420,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range5,false);
          __end5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&__range5);
          lib = (string *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range5);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end5,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)&lib), uVar4 = systemFile.field_2._8_8_, bVar2) {
            buildType.field_2._8_8_ =
                 __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end5);
            cmTarget::AddLinkLibrary
                      (local_3b0,(cmMakefile *)systemFile.field_2._8_8_,
                       (string *)buildType.field_2._8_8_,GENERAL_LibraryType);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end5);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4c0,"CMAKE_BUILD_TYPE",&local_4c1);
          psVar3 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar4,&local_4c0);
          std::__cxx11::string::string((string *)local_4a0,(string *)psVar3);
          std::__cxx11::string::~string((string *)&local_4c0);
          std::allocator<char>::~allocator(&local_4c1);
          cmsys::SystemTools::UpperCase((string *)((long)&linkLibs.field_2 + 8),(string *)local_4a0)
          ;
          std::__cxx11::string::operator=
                    ((string *)local_4a0,(string *)(linkLibs.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(linkLibs.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)(frameworkPath.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)(linkPath.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)(flags.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)(linkFlags.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)&gtgt);
          cmGlobalGenerator::CreateGenerationObjects
                    ((cmGlobalGenerator *)snapshot.Position.Position,AllTargets);
          this_01 = snapshot.Position.Position;
          psVar3 = cmTarget::GetName_abi_cxx11_(local_3b0);
          this_05 = cmGlobalGenerator::FindGeneratorTarget((cmGlobalGenerator *)this_01,psVar3);
          linkLineComputer._56_8_ = cmGeneratorTarget::GetLocalGenerator(this_05);
          local_828 = (cmOutputConverter *)0x0;
          if ((cmLocalGenerator *)linkLineComputer._56_8_ != (cmLocalGenerator *)0x0) {
            local_828 = &((cmLocalGenerator *)linkLineComputer._56_8_)->super_cmOutputConverter;
          }
          cmLocalGenerator::GetStateSnapshot(&local_618,(cmLocalGenerator *)linkLineComputer._56_8_)
          ;
          cmStateSnapshot::GetDirectory(&local_600,&local_618);
          cmLinkLineComputer::cmLinkLineComputer
                    ((cmLinkLineComputer *)local_5d8,local_828,&local_600);
          cmLocalGenerator::GetTargetFlags
                    ((cmLocalGenerator *)linkLineComputer._56_8_,(cmLinkLineComputer *)local_5d8,
                     (string *)local_4a0,(string *)((long)&frameworkPath.field_2 + 8),
                     (string *)((long)&linkFlags.field_2 + 8),(string *)&gtgt,
                     (string *)((long)&linkPath.field_2 + 8),(string *)((long)&flags.field_2 + 8),
                     this_05);
          std::operator+(&local_658,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&linkPath.field_2 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&flags.field_2 + 8));
          std::operator+(&local_638,&local_658,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&frameworkPath.field_2 + 8));
          std::__cxx11::string::operator=
                    ((string *)(frameworkPath.field_2._M_local_buf + 8),(string *)&local_638);
          std::__cxx11::string::~string((string *)&local_638);
          std::__cxx11::string::~string((string *)&local_658);
          uVar4 = std::__cxx11::string::c_str();
          printf("%s\n",uVar4);
          cmLinkLineComputer::~cmLinkLineComputer((cmLinkLineComputer *)local_5d8);
          std::__cxx11::string::~string((string *)&gtgt);
          std::__cxx11::string::~string((string *)(linkFlags.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(flags.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(linkPath.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(frameworkPath.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_4a0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range5);
          std::__cxx11::string::~string((string *)local_420);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&tgt);
        }
      }
    }
  }
  bVar1 = local_23a;
  std::__cxx11::string::~string(local_218);
  std::__cxx11::string::~string((string *)local_1d0);
  std::__cxx11::string::~string((string *)local_188);
  std::__cxx11::string::~string((string *)local_140);
  return (bool)(bVar1 & 1);
}

Assistant:

bool cmake::FindPackage(const std::vector<std::string>& args)
{
  this->SetHomeDirectory(cmSystemTools::GetCurrentWorkingDirectory());
  this->SetHomeOutputDirectory(cmSystemTools::GetCurrentWorkingDirectory());

  // if a generator was not yet created, temporarily create one
  cmGlobalGenerator* gg = new cmGlobalGenerator(this);
  this->SetGlobalGenerator(gg);

  cmStateSnapshot snapshot = this->GetCurrentSnapshot();
  snapshot.GetDirectory().SetCurrentBinary(
    cmSystemTools::GetCurrentWorkingDirectory());
  snapshot.GetDirectory().SetCurrentSource(
    cmSystemTools::GetCurrentWorkingDirectory());
  // read in the list file to fill the cache
  snapshot.SetDefaultDefinitions();
  cmMakefile* mf = new cmMakefile(gg, snapshot);
  gg->AddMakefile(mf);

  mf->SetArgcArgv(args);

  std::string systemFile = mf->GetModulesFile("CMakeFindPackageMode.cmake");
  mf->ReadListFile(systemFile);

  std::string language = mf->GetSafeDefinition("LANGUAGE");
  std::string mode = mf->GetSafeDefinition("MODE");
  std::string packageName = mf->GetSafeDefinition("NAME");
  bool packageFound = mf->IsOn("PACKAGE_FOUND");
  bool quiet = mf->IsOn("PACKAGE_QUIET");

  if (!packageFound) {
    if (!quiet) {
      printf("%s not found.\n", packageName.c_str());
    }
  } else if (mode == "EXIST") {
    if (!quiet) {
      printf("%s found.\n", packageName.c_str());
    }
  } else if (mode == "COMPILE") {
    std::string includes = mf->GetSafeDefinition("PACKAGE_INCLUDE_DIRS");
    std::vector<std::string> includeDirs;
    cmSystemTools::ExpandListArgument(includes, includeDirs);

    gg->CreateGenerationObjects();
    cmLocalGenerator* lg = gg->LocalGenerators[0];
    std::string includeFlags =
      lg->GetIncludeFlags(includeDirs, nullptr, language);

    std::string definitions = mf->GetSafeDefinition("PACKAGE_DEFINITIONS");
    printf("%s %s\n", includeFlags.c_str(), definitions.c_str());
  } else if (mode == "LINK") {
    const char* targetName = "dummy";
    std::vector<std::string> srcs;
    cmTarget* tgt = mf->AddExecutable(targetName, srcs, true);
    tgt->SetProperty("LINKER_LANGUAGE", language.c_str());

    std::string libs = mf->GetSafeDefinition("PACKAGE_LIBRARIES");
    std::vector<std::string> libList;
    cmSystemTools::ExpandListArgument(libs, libList);
    for (std::string const& lib : libList) {
      tgt->AddLinkLibrary(*mf, lib, GENERAL_LibraryType);
    }

    std::string buildType = mf->GetSafeDefinition("CMAKE_BUILD_TYPE");
    buildType = cmSystemTools::UpperCase(buildType);

    std::string linkLibs;
    std::string frameworkPath;
    std::string linkPath;
    std::string flags;
    std::string linkFlags;
    gg->CreateGenerationObjects();
    cmGeneratorTarget* gtgt = gg->FindGeneratorTarget(tgt->GetName());
    cmLocalGenerator* lg = gtgt->GetLocalGenerator();
    cmLinkLineComputer linkLineComputer(lg,
                                        lg->GetStateSnapshot().GetDirectory());
    lg->GetTargetFlags(&linkLineComputer, buildType, linkLibs, flags,
                       linkFlags, frameworkPath, linkPath, gtgt);
    linkLibs = frameworkPath + linkPath + linkLibs;

    printf("%s\n", linkLibs.c_str());

    /*    if ( use_win32 )
          {
          tgt->SetProperty("WIN32_EXECUTABLE", "ON");
          }
        if ( use_macbundle)
          {
          tgt->SetProperty("MACOSX_BUNDLE", "ON");
          }*/
  }

  // free generic one if generated
  //  this->SetGlobalGenerator(0); // setting 0-pointer is not possible
  //  delete gg; // this crashes inside the cmake instance

  return packageFound;
}